

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  int iVar1;
  int iVar2;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 local_80;
  secp256k1_fe local_58;
  
  iVar1 = secp256k1_fe_normalizes_to_zero(x);
  secp256k1_fe_verify(x);
  local_58.n[0] = x->n[0];
  local_58.n[1] = x->n[1];
  local_58.n[2] = x->n[2];
  local_58.n[3] = x->n[3];
  local_58.n[4] = x->n[4];
  local_58.magnitude = x->magnitude;
  local_58.normalized = x->normalized;
  secp256k1_fe_normalize(&local_58);
  secp256k1_fe_to_signed62(&local_80,&local_58);
  secp256k1_modinv64(&local_80,&secp256k1_const_modinfo_fe);
  secp256k1_fe_from_signed62(r,&local_80);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  iVar2 = secp256k1_fe_normalizes_to_zero(r);
  if (iVar2 == iVar1) {
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/field_impl.h"
          ,0x192,"test condition failed: secp256k1_fe_normalizes_to_zero(r) == input_is_zero");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}